

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

bool Diligent::VerifyResourceStates(RESOURCE_STATE State,bool IsTexture)

{
  String *pSVar1;
  undefined *puVar2;
  RESOURCE_STATE RVar3;
  undefined8 uVar4;
  RESOURCE_STATE State_00;
  RESOURCE_STATE State_01;
  RESOURCE_STATE State_02;
  RESOURCE_STATE State_03;
  RESOURCE_STATE State_04;
  RESOURCE_STATE State_05;
  RESOURCE_STATE State_06;
  RESOURCE_STATE State_07;
  RESOURCE_STATE State_08;
  RESOURCE_STATE State_09;
  RESOURCE_STATE State_10;
  RESOURCE_STATE State_11;
  RESOURCE_STATE State_12;
  RESOURCE_STATE RVar5;
  char (*in_R8) [280];
  String local_368;
  undefined1 local_348 [8];
  string _msg_12;
  undefined1 local_308 [8];
  string _msg_11;
  undefined1 local_2c8 [8];
  string _msg_10;
  undefined1 local_288 [8];
  string _msg_9;
  undefined1 local_248 [8];
  string _msg_8;
  undefined1 local_208 [8];
  string _msg_7;
  undefined1 local_1c8 [8];
  string _msg_6;
  undefined1 local_188 [8];
  string _msg_5;
  undefined1 local_148 [8];
  string _msg_4;
  undefined1 local_108 [8];
  string _msg_3;
  undefined1 local_c8 [8];
  string _msg_2;
  undefined1 local_88 [8];
  string _msg_1;
  String local_58;
  undefined1 local_38 [8];
  string _msg;
  bool IsTexture_local;
  RESOURCE_STATE State_local;
  
  RVar5 = RESOURCE_STATE_COMMON;
  _msg.field_2._M_local_buf[0xf] = IsTexture;
  RVar3 = operator&(State,RESOURCE_STATE_COMMON);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)
                      &std::
                       deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                       ::_S_max_size,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      GetResourceStateString_abi_cxx11_(&local_58,(Diligent *)(ulong)State,State_00);
      FormatString<char[7],std::__cxx11::string,char[74]>
                ((string *)local_38,(Diligent *)"State ",(char (*) [7])&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_COMMON can\'t be combined with any other state",
                 (char (*) [74])in_R8);
      std::__cxx11::string::~string((string *)&local_58);
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_38);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_UNDEFINED;
  RVar3 = operator&(State,RESOURCE_STATE_UNDEFINED);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x1,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_2.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_01);
      FormatString<char[7],std::__cxx11::string,char[77]>
                ((string *)local_88,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_UNDEFINED can\'t be combined with any other state",
                 (char (*) [77])in_R8);
      std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_88);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_UNORDERED_ACCESS;
  RVar3 = operator&(State,RESOURCE_STATE_UNORDERED_ACCESS);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x20,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_3.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_02);
      FormatString<char[7],std::__cxx11::string,char[84]>
                ((string *)local_c8,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_UNORDERED_ACCESS can\'t be combined with any other state"
                 ,(char (*) [84])in_R8);
      std::__cxx11::string::~string((string *)(_msg_3.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_c8);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_RENDER_TARGET;
  RVar3 = operator&(State,RESOURCE_STATE_RENDER_TARGET);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x10,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_4.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_03);
      FormatString<char[7],std::__cxx11::string,char[81]>
                ((string *)local_108,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_RENDER_TARGET can\'t be combined with any other state"
                 ,(char (*) [81])in_R8);
      std::__cxx11::string::~string((string *)(_msg_4.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_108);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_DEPTH_WRITE;
  RVar3 = operator&(State,RESOURCE_STATE_DEPTH_WRITE);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x40,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_5.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_04);
      FormatString<char[7],std::__cxx11::string,char[79]>
                ((string *)local_148,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_DEPTH_WRITE can\'t be combined with any other state",
                 (char (*) [79])in_R8);
      std::__cxx11::string::~string((string *)(_msg_5.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_148);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_COPY_DEST;
  RVar3 = operator&(State,RESOURCE_STATE_COPY_DEST);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x800,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_6.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_05);
      FormatString<char[7],std::__cxx11::string,char[77]>
                ((string *)local_188,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_COPY_DEST can\'t be combined with any other state",
                 (char (*) [77])in_R8);
      std::__cxx11::string::~string((string *)(_msg_6.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_188);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_RESOLVE_DEST;
  RVar3 = operator&(State,RESOURCE_STATE_RESOLVE_DEST);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x2000,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_7.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_06);
      FormatString<char[7],std::__cxx11::string,char[80]>
                ((string *)local_1c8,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_RESOLVE_DEST can\'t be combined with any other state",
                 (char (*) [80])in_R8);
      std::__cxx11::string::~string((string *)(_msg_7.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_1c8);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_PRESENT;
  RVar3 = operator&(State,RESOURCE_STATE_PRESENT);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x10000,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_8.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_07);
      FormatString<char[7],std::__cxx11::string,char[75]>
                ((string *)local_208,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_PRESENT can\'t be combined with any other state",
                 (char (*) [75])in_R8);
      std::__cxx11::string::~string((string *)(_msg_8.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_208);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_BUILD_AS_WRITE;
  RVar3 = operator&(State,RESOURCE_STATE_BUILD_AS_WRITE);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x40000,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_9.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_08);
      FormatString<char[7],std::__cxx11::string,char[82]>
                ((string *)local_248,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_BUILD_AS_WRITE can\'t be combined with any other state"
                 ,(char (*) [82])in_R8);
      std::__cxx11::string::~string((string *)(_msg_9.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_248);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_RAY_TRACING;
  RVar3 = operator&(State,RESOURCE_STATE_RAY_TRACING);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)0x80000,RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_10.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_09);
      FormatString<char[7],std::__cxx11::string,char[79]>
                ((string *)local_288,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_RAY_TRACING can\'t be combined with any other state",
                 (char (*) [79])in_R8);
      std::__cxx11::string::~string((string *)(_msg_10.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_288);
      return false;
    }
  }
  RVar5 = RESOURCE_STATE_MAX_BIT;
  RVar3 = operator&(State,RESOURCE_STATE_MAX_BIT);
  if (RVar3 != RESOURCE_STATE_UNKNOWN) {
    RVar3 = operator~((Diligent *)std::__iterator_category<VkAccelerationStructureGeometryKHR*>,
                      RVar5);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_11.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_10);
      FormatString<char[7],std::__cxx11::string,char[80]>
                ((string *)local_2c8,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: RESOURCE_STATE_SHADING_RATE can\'t be combined with any other state",
                 (char (*) [80])in_R8);
      std::__cxx11::string::~string((string *)(_msg_11.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_2c8);
      return false;
    }
  }
  if ((_msg.field_2._M_local_buf[0xf] & 1U) == 0) {
    RVar3 = operator|(RESOURCE_STATE_RENDER_TARGET,RESOURCE_STATE_DEPTH_WRITE);
    RVar3 = operator|(RVar3,RESOURCE_STATE_DEPTH_READ);
    RVar3 = operator|(RVar3,RESOURCE_STATE_RESOLVE_SOURCE);
    RVar3 = operator|(RVar3,RESOURCE_STATE_RESOLVE_DEST);
    RVar3 = operator|(RVar3,RESOURCE_STATE_PRESENT);
    RVar3 = operator|(RVar3,RESOURCE_STATE_MAX_BIT);
    RVar3 = operator|(RVar3,RESOURCE_STATE_INPUT_ATTACHMENT);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      GetResourceStateString_abi_cxx11_(&local_368,(Diligent *)(ulong)State,State_12);
      FormatString<char[7],std::__cxx11::string,char[280]>
                ((string *)local_348,(Diligent *)"State ",(char (*) [7])&local_368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: states RESOURCE_STATE_RENDER_TARGET, RESOURCE_STATE_DEPTH_WRITE, RESOURCE_STATE_DEPTH_READ, RESOURCE_STATE_RESOLVE_SOURCE, RESOURCE_STATE_RESOLVE_DEST, RESOURCE_STATE_PRESENT, RESOURCE_STATE_INPUT_ATTACHMENT, RESOURCE_STATE_SHADING_RATE are not applicable to buffers"
                 ,in_R8);
      std::__cxx11::string::~string((string *)&local_368);
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_348);
      return false;
    }
  }
  else {
    RVar3 = operator|(RESOURCE_STATE_VERTEX_BUFFER,RESOURCE_STATE_CONSTANT_BUFFER);
    RVar3 = operator|(RVar3,RESOURCE_STATE_INDEX_BUFFER);
    RVar3 = operator|(RVar3,RESOURCE_STATE_STREAM_OUT);
    RVar3 = operator|(RVar3,RESOURCE_STATE_INDIRECT_ARGUMENT);
    RVar3 = operator&(State,RVar3);
    if (RVar3 != RESOURCE_STATE_UNKNOWN) {
      pSVar1 = (String *)((long)&_msg_12.field_2 + 8);
      GetResourceStateString_abi_cxx11_(pSVar1,(Diligent *)(ulong)State,State_11);
      FormatString<char[7],std::__cxx11::string,char[202]>
                ((string *)local_308,(Diligent *)"State ",(char (*) [7])pSVar1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " is invalid: states RESOURCE_STATE_VERTEX_BUFFER, RESOURCE_STATE_CONSTANT_BUFFER, RESOURCE_STATE_INDEX_BUFFER, RESOURCE_STATE_STREAM_OUT, RESOURCE_STATE_INDIRECT_ARGUMENT are not applicable to textures"
                 ,(char (*) [202])in_R8);
      std::__cxx11::string::~string((string *)(_msg_12.field_2._M_local_buf + 8));
      puVar2 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar2)(2,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_308);
      return false;
    }
  }
  return true;
}

Assistant:

bool VerifyResourceStates(RESOURCE_STATE State, bool IsTexture)
{
    static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "Please update this function to handle the new resource state");

    // clang-format off
#define VERIFY_EXCLUSIVE_STATE(ExclusiveState)\
if ( (State & ExclusiveState) != 0 && (State & ~ExclusiveState) != 0 )\
{\
    LOG_ERROR_MESSAGE("State ", GetResourceStateString(State), " is invalid: " #ExclusiveState " can't be combined with any other state");\
    return false;\
}

    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_COMMON);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_UNDEFINED);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_UNORDERED_ACCESS);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_RENDER_TARGET);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_DEPTH_WRITE);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_COPY_DEST);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_RESOLVE_DEST);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_PRESENT);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_BUILD_AS_WRITE);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_RAY_TRACING);
    VERIFY_EXCLUSIVE_STATE(RESOURCE_STATE_SHADING_RATE);
#undef VERIFY_EXCLUSIVE_STATE
    // clang-format on

    if (IsTexture)
    {
        // clang-format off
        if (State &
            (RESOURCE_STATE_VERTEX_BUFFER   |
             RESOURCE_STATE_CONSTANT_BUFFER |
             RESOURCE_STATE_INDEX_BUFFER    |
             RESOURCE_STATE_STREAM_OUT      |
             RESOURCE_STATE_INDIRECT_ARGUMENT))
        {
            LOG_ERROR_MESSAGE("State ", GetResourceStateString(State), " is invalid: states RESOURCE_STATE_VERTEX_BUFFER, "
                              "RESOURCE_STATE_CONSTANT_BUFFER, RESOURCE_STATE_INDEX_BUFFER, RESOURCE_STATE_STREAM_OUT, "
                              "RESOURCE_STATE_INDIRECT_ARGUMENT are not applicable to textures");
            return false;
        }
        // clang-format on
    }
    else
    {
        // clang-format off
        if (State &
            (RESOURCE_STATE_RENDER_TARGET  |
             RESOURCE_STATE_DEPTH_WRITE    |
             RESOURCE_STATE_DEPTH_READ     |
             RESOURCE_STATE_RESOLVE_SOURCE |
             RESOURCE_STATE_RESOLVE_DEST   |
             RESOURCE_STATE_PRESENT        |
             RESOURCE_STATE_SHADING_RATE   |
             RESOURCE_STATE_INPUT_ATTACHMENT))
        {
            LOG_ERROR_MESSAGE("State ", GetResourceStateString(State), " is invalid: states RESOURCE_STATE_RENDER_TARGET, "
                              "RESOURCE_STATE_DEPTH_WRITE, RESOURCE_STATE_DEPTH_READ, RESOURCE_STATE_RESOLVE_SOURCE, "
                              "RESOURCE_STATE_RESOLVE_DEST, RESOURCE_STATE_PRESENT, RESOURCE_STATE_INPUT_ATTACHMENT, RESOURCE_STATE_SHADING_RATE "
                              "are not applicable to buffers");
            return false;
        }
        // clang-format on
    }

    return true;
}